

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockIterator.hpp
# Opt level: O2

bool __thiscall
gmlc::containers::BlockIterator<helics::Endpoint_const,32,helics::Endpoint_const*const*>::
checkEquivalence<helics::Endpoint**>
          (BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*> *this,
          Endpoint **testv,int testoffset)

{
  Endpoint **ppEVar1;
  
  ppEVar1 = this->vec;
  if ((ppEVar1 != testv) &&
     ((((testv == (Endpoint **)0x0 || (ppEVar1 == (Endpoint **)0x0)) || (*testv != (Endpoint *)0x0))
      || (*ppEVar1 != (Endpoint *)0x0)))) {
    return false;
  }
  return this->offset == testoffset;
}

Assistant:

bool checkEquivalence(OUTER2 testv, int testoffset) const
        {
            return (
                (testv == vec ||
                 ((testv != nullptr && *testv == nullptr) &&
                  (vec != nullptr && *vec == nullptr))) &&
                testoffset == offset);
        }